

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

PHYSFS_ErrorCode PHYSFS_getLastErrorCode(void)

{
  ErrState *pEVar1;
  PHYSFS_ErrorCode local_18;
  PHYSFS_ErrorCode retval;
  ErrState *err;
  
  pEVar1 = findErrorForCurrentThread();
  if (pEVar1 == (ErrState *)0x0) {
    local_18 = PHYSFS_ERR_OK;
  }
  else {
    local_18 = pEVar1->code;
    pEVar1->code = PHYSFS_ERR_OK;
  }
  return local_18;
}

Assistant:

PHYSFS_ErrorCode PHYSFS_getLastErrorCode(void)
{
    ErrState *err = findErrorForCurrentThread();
    const PHYSFS_ErrorCode retval = (err) ? err->code : PHYSFS_ERR_OK;
    if (err)
        err->code = PHYSFS_ERR_OK;
    return retval;
}